

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_gate_accepts(lws_context *context,int on)

{
  int iVar1;
  lws *wsi;
  lws_dll2 *d;
  lws_vhost *v;
  int on_local;
  lws_context *context_local;
  
  d = (lws_dll2 *)context->vhost_list;
  _lws_log(4,"%s: on = %d\n","lws_gate_accepts",(ulong)(uint)on);
  for (; d != (lws_dll2 *)0x0; d = d[0x14].next) {
    for (wsi = (lws *)lws_dll2_get_head((lws_dll2_owner *)(d + 0x15)); wsi != (lws *)0x0;
        wsi = (lws *)(wsi->a).vhost) {
      if ((*(int *)&d[0x21].next != 0) &&
         (iVar1 = lws_change_pollfd((lws *)&wsi[-1].sul_connect_timeout.list.owner,(uint)(on == 0),
                                    (uint)(on != 0)), iVar1 != 0)) {
        _lws_log(4,"%s: Unable to set POLLIN %d\n","lws_gate_accepts",(ulong)(uint)on);
      }
    }
  }
  return 0;
}

Assistant:

int
lws_gate_accepts(struct lws_context *context, int on)
{
	struct lws_vhost *v = context->vhost_list;

	lwsl_notice("%s: on = %d\n", __func__, on);

	while (v) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&v->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			if (v->tls.use_ssl &&
			    lws_change_pollfd(wsi, on ? 0 : LWS_POLLIN,
						   on ? LWS_POLLIN : 0))
				lwsl_notice("%s: Unable to set POLLIN %d\n",
					    __func__, on);
		} lws_end_foreach_dll(d);

		v = v->vhost_next;
	}

	return 0;
}